

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverageFuncs.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::CoverageNameOrHierFunc::CoverageNameOrHierFunc
          (CoverageNameOrHierFunc *this,KnownSystemName knownNameId,Type *returnType,
          uint nameOrHierIndex,size_t requiredArgs,
          vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *argTypes)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,knownNameId,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__CoverageNameOrHierFunc_006b0fc0;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&this->argTypes,argTypes);
  this->returnType = returnType;
  this->nameOrHierIndex = nameOrHierIndex;
  this->requiredArgs = requiredArgs;
  return;
}

Assistant:

CoverageNameOrHierFunc(KnownSystemName knownNameId, const Type& returnType,
                           unsigned int nameOrHierIndex, size_t requiredArgs = 0,
                           const std::vector<const Type*>& argTypes = {}) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), argTypes(argTypes),
        returnType(&returnType), nameOrHierIndex(nameOrHierIndex), requiredArgs(requiredArgs) {
        SLANG_ASSERT(requiredArgs <= argTypes.size());
        SLANG_ASSERT(nameOrHierIndex <= argTypes.size());
        SLANG_ASSERT(requiredArgs > nameOrHierIndex);
    }